

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> __thiscall
async_simple::coro::detail::
LazyAwaiterBase<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
::awaitResume(LazyAwaiterBase<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
              *this)

{
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>_>
  *in_RSI;
  tuple<cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_> in_RDI;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> r;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
  *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_cinatra::coro_http_client_*,_false> this_00;
  LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00._M_head_impl =
       (coro_http_client *)
       in_RDI.
       super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
       .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>_>
  ::promise(in_RSI);
  LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::result(in_stack_ffffffffffffffe0);
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              *)this_00._M_head_impl,in_stack_ffffffffffffffb8);
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>_>
  ::destroy((coroutine_handle<async_simple::coro::detail::LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>_>
             *)0x2ed539);
  std::
  coroutine_handle<async_simple::coro::detail::LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>_>
  ::operator=(in_RSI,(nullptr_t)0x0);
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              *)this_00._M_head_impl,in_stack_ffffffffffffffb8);
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               *)this_00._M_head_impl);
  return (__uniq_ptr_data<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>,_true,_true>
          )(__uniq_ptr_data<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
             .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }